

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbtree.c
# Opt level: O0

RBTREE_NODE * rbtree_fini_step(RBTREE *tree)

{
  RBTREE_NODE *node;
  RBTREE_NODE **pointer_down_to_node;
  RBTREE *tree_local;
  
  node = tree->root;
  pointer_down_to_node = &tree->root;
  if (node != (RBTREE_NODE *)0x0) {
    for (; ((ulong)node->lc & 0xfffffffffffffffe) != 0;
        node = (RBTREE_NODE *)((ulong)node->lc & 0xfffffffffffffffe)) {
      pointer_down_to_node = &node->lc;
    }
    *pointer_down_to_node = node->r;
  }
  return node;
}

Assistant:

RBTREE_NODE*
rbtree_fini_step(RBTREE* tree)
{
    RBTREE_NODE** pointer_down_to_node = &tree->root;
    RBTREE_NODE* node = tree->root;

    if(node != NULL) {
        /* Go down as far as possible through left children. */
        while(LEFT(node) != NULL) {
            pointer_down_to_node = &node->lc;
            node = LEFT(node);
        }

        /* The node now can have at most one child (the right one). I.e. we can
         * rip out the current node and "upgrade" the right subtree (or NULL)
         * one level up into this node's place. This should be cheaper than
         * iterating to some leaf in the right subtree. */
        *pointer_down_to_node = RIGHT(node);
    }

    return node;
}